

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects_Buffer.cpp
# Opt level: O0

channel_t * __thiscall
Effects_Buffer::channel(channel_t *__return_storage_ptr__,Effects_Buffer *this,int i,int type)

{
  channel_t *pcVar1;
  int out;
  int type_local;
  int i_local;
  Effects_Buffer *this_local;
  
  out = 2;
  if (type == 0) {
    out = i % 5;
    if (2 < out) {
      out = 2;
    }
  }
  else if (((type & 0x200U) == 0) && ((type & 0xffU) % 3 != 0)) {
    out = type & 1;
  }
  pcVar1 = this->chan_types + out;
  __return_storage_ptr__->center = pcVar1->center;
  __return_storage_ptr__->left = pcVar1->left;
  __return_storage_ptr__->right = pcVar1->right;
  return __return_storage_ptr__;
}

Assistant:

Effects_Buffer::channel_t Effects_Buffer::channel( int i, int type )
{
	int out = 2;
	if ( !type )
	{
		out = i % 5;
		if ( out > 2 )
			out = 2;
	}
	else if ( !(type & noise_type) && (type & type_index_mask) % 3 != 0 )
	{
		out = type & 1;
	}
	return chan_types [out];
}